

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

CharClass * re2::CharClass::New(int maxranges)

{
  CharClass *pCVar1;
  
  pCVar1 = (CharClass *)operator_new__((long)maxranges * 8 + 0x18);
  *(CharClass **)(pCVar1 + 8) = pCVar1 + 0x18;
  *(undefined4 *)(pCVar1 + 0x10) = 0;
  *pCVar1 = (CharClass)0x0;
  *(undefined4 *)(pCVar1 + 4) = 0;
  return pCVar1;
}

Assistant:

CharClass* CharClass::New(int maxranges) {
  CharClass* cc;
  uint8_t* data = new uint8_t[sizeof *cc + maxranges*sizeof cc->ranges_[0]];
  cc = reinterpret_cast<CharClass*>(data);
  cc->ranges_ = reinterpret_cast<RuneRange*>(data + sizeof *cc);
  cc->nranges_ = 0;
  cc->folds_ascii_ = false;
  cc->nrunes_ = 0;
  return cc;
}